

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

filename_t * spdlog::details::os::dir_name(filename_t *path)

{
  long lVar1;
  ulong in_RSI;
  filename_t *in_RDI;
  size_type pos;
  
  lVar1 = std::__cxx11::string::find_last_of((char)in_RSI,0x2f);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,in_RSI);
  }
  return in_RDI;
}

Assistant:

SPDLOG_INLINE filename_t dir_name(filename_t path)
{
#ifdef _WIN32
    // support forward slash in windows
    std::replace(path.begin(), path.end(), '/', folder_sep);
#endif
    auto pos = path.find_last_of(folder_sep);
    return pos != filename_t::npos ? path.substr(0, pos) : filename_t{};
}